

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrppm.c
# Opt level: O3

void put_demapped_rgb(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  byte bVar1;
  JDIMENSION JVar2;
  JSAMPARRAY ppJVar3;
  JSAMPROW pJVar4;
  JSAMPROW pJVar5;
  JSAMPROW pJVar6;
  JSAMPROW pJVar7;
  ppm_dest_ptr dest;
  _func_void_j_decompress_ptr_djpeg_dest_ptr *__ptr;
  long lVar8;
  
  __ptr = dinfo[1].start_output;
  JVar2 = cinfo->output_width;
  if (JVar2 != 0) {
    ppJVar3 = cinfo->colormap;
    pJVar4 = *ppJVar3;
    pJVar5 = ppJVar3[1];
    pJVar6 = ppJVar3[2];
    pJVar7 = *dinfo->buffer;
    lVar8 = 0;
    do {
      bVar1 = pJVar7[lVar8];
      *__ptr = (_func_void_j_decompress_ptr_djpeg_dest_ptr)pJVar4[bVar1];
      __ptr[1] = (_func_void_j_decompress_ptr_djpeg_dest_ptr)pJVar5[bVar1];
      __ptr[2] = (_func_void_j_decompress_ptr_djpeg_dest_ptr)pJVar6[bVar1];
      lVar8 = lVar8 + 1;
      __ptr = __ptr + 3;
    } while (JVar2 != (JDIMENSION)lVar8);
    __ptr = dinfo[1].start_output;
  }
  fwrite(__ptr,1,(size_t)dinfo[1].finish_output,(FILE *)dinfo->output_file);
  return;
}

Assistant:

METHODDEF(void)
put_demapped_rgb(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
                 JDIMENSION rows_supplied)
{
  ppm_dest_ptr dest = (ppm_dest_ptr)dinfo;
  register char *bufferptr;
  register int pixval;
  register JSAMPROW ptr;
  register JSAMPROW color_map0 = cinfo->colormap[0];
  register JSAMPROW color_map1 = cinfo->colormap[1];
  register JSAMPROW color_map2 = cinfo->colormap[2];
  register JDIMENSION col;

  ptr = dest->pub.buffer[0];
  bufferptr = dest->iobuffer;
  for (col = cinfo->output_width; col > 0; col--) {
    pixval = *ptr++;
    PUTPPMSAMPLE(bufferptr, color_map0[pixval]);
    PUTPPMSAMPLE(bufferptr, color_map1[pixval]);
    PUTPPMSAMPLE(bufferptr, color_map2[pixval]);
  }
  (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->buffer_width);
}